

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O1

Query * simplify_minof(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  pointer pQVar1;
  pointer pQVar2;
  uint32_t uVar3;
  QueryType *pQVar4;
  vector<Query,_std::allocator<Query>_> *pvVar5;
  QueryType local_68;
  vector<QToken,_std::allocator<QToken>_> local_60;
  PrimitiveQuery local_48;
  uint32_t local_40;
  vector<Query,_std::allocator<Query>_> local_38;
  
  pQVar4 = Query::get_type(q);
  if (*pQVar4 == MIN_OF) {
    uVar3 = Query::as_count(q);
    pvVar5 = Query::as_queries(q);
    if (((long)(pvVar5->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar5->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - (ulong)uVar3 == 0) {
      *changed = true;
      pvVar5 = Query::as_queries(q);
      q_and(pvVar5);
    }
    else {
      uVar3 = Query::as_count(q);
      if (uVar3 == 1) {
        *changed = true;
        pvVar5 = Query::as_queries(q);
        q_or(pvVar5);
      }
      else {
        uVar3 = Query::as_count(q);
        if (uVar3 != 0) goto LAB_0014be7f;
        *changed = true;
        q_everything();
      }
    }
    __return_storage_ptr__->type = local_68;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_60.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_60.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_60.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_60.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_60.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_60.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->count = local_40;
    __return_storage_ptr__->ngram = local_48;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_38.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_38.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_38.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<Query,_std::allocator<Query>_>::~vector(&local_38);
    std::vector<QToken,_std::allocator<QToken>_>::~vector(&local_60);
  }
  else {
LAB_0014be7f:
    __return_storage_ptr__->type = q->type;
    pQVar1 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar1;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->count = q->count;
    __return_storage_ptr__->ngram = q->ngram;
    pQVar2 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar2;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Query simplify_minof(Query &&q, bool *changed) {
    if (q.get_type() == QueryType::MIN_OF) {
        if (q.as_count() == q.as_queries().size()) {
            *changed = true;
            return std::move(q_and(std::move(q.as_queries())));
        } else if (q.as_count() == 1) {
            *changed = true;
            return std::move(q_or(std::move(q.as_queries())));
        } else if (q.as_count() == 0) {
            *changed = true;
            return std::move(q_everything());
        }
    }
    return std::move(q);
}